

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test::
~MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test
          (MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test *this)

{
  MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test *this_local;
  
  ~MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyTestSkipRequiredField) {
  // Create the testing protos
  unittest::TestRequired msg1;
  unittest::TestRequired msg2;

  msg1.set_a(401);
  msg2.set_a(401);
  msg2.set_b(402);

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}